

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::_add_flag_internal(App *this,string *flag_name,callback_t *fun,string *flag_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MultiOptionPolicy MVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  Option *this_00;
  IncorrectConstruction *__return_storage_ptr__;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fname;
  pointer __x;
  size_type __pos;
  string pos_name;
  _Any_data local_1a8;
  _Manager_type local_198;
  _Invoker_type local_190;
  _Any_data local_188;
  _Manager_type local_178;
  _Invoker_type local_170;
  App *local_160;
  string local_158;
  string local_138;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  string local_50;
  
  lVar6 = ::std::__cxx11::string::find_first_of((char *)flag_name,0x144b07,0);
  if (lVar6 == -1) {
    local_158._M_dataplus._M_p = (flag_name->_M_dataplus)._M_p;
    paVar1 = &flag_name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == paVar1) {
      local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&flag_name->field_2 + 8);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_158._M_string_length = flag_name->_M_string_length;
    (flag_name->_M_dataplus)._M_p = (pointer)paVar1;
    flag_name->_M_string_length = 0;
    (flag_name->field_2)._M_local_buf[0] = '\0';
    local_198 = (_Manager_type)0x0;
    local_1a8._M_unused._M_object = (void *)0x0;
    local_1a8._8_8_ = 0;
    local_190 = fun->_M_invoker;
    p_Var4 = (fun->super__Function_base)._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      local_1a8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor
      ;
      local_1a8._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
      (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
      fun->_M_invoker = (_Invoker_type)0x0;
      local_198 = p_Var4;
    }
    local_d8._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
    paVar1 = &flag_description->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar1) {
      local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_d8.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_d8._M_string_length = flag_description->_M_string_length;
    (flag_description->_M_dataplus)._M_p = (pointer)paVar1;
    flag_description->_M_string_length = 0;
    (flag_description->field_2)._M_local_buf[0] = '\0';
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    this_00 = add_option(this,&local_158,(callback_t *)&local_1a8,&local_d8,false,
                         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                          *)&local_98);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_198 != (_Manager_type)0x0) {
      (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  else {
    local_160 = this;
    detail::get_default_flag_values(&local_118,flag_name);
    uVar7 = ::std::__cxx11::string::find((char)flag_name,0x7b);
    while (uVar7 != 0xffffffffffffffff) {
      lVar6 = ::std::__cxx11::string::find_first_of((char *)flag_name,0x144b31,uVar7 + 1);
      if ((lVar6 != -1) && (pcVar3 = (flag_name->_M_dataplus)._M_p, pcVar3[lVar6] == '}')) {
        if (pcVar3 + flag_name->_M_string_length == pcVar3 + lVar6 + 1) {
          flag_name->_M_string_length = uVar7;
          pcVar3[uVar7] = '\0';
        }
        else {
          ::std::__cxx11::string::_M_erase((ulong)flag_name,uVar7);
        }
      }
      uVar7 = ::std::__cxx11::string::find((char)flag_name,0x7b);
    }
    _Var8._M_current = (flag_name->_M_dataplus)._M_p;
    local_f8._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_f8._M_dataplus._M_p >> 8);
    local_f8._M_dataplus._M_p._0_1_ = 0x21;
    _Var8 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var8,_Var8._M_current + flag_name->_M_string_length,
                       (_Iter_equals_val<const_char>)&local_f8);
    this = local_160;
    flag_name->_M_string_length = (long)_Var8._M_current - (long)(flag_name->_M_dataplus)._M_p;
    *_Var8._M_current = '\0';
    local_138._M_dataplus._M_p = (flag_name->_M_dataplus)._M_p;
    paVar1 = &flag_name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar1) {
      local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&flag_name->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_138._M_string_length = flag_name->_M_string_length;
    (flag_name->_M_dataplus)._M_p = (pointer)paVar1;
    flag_name->_M_string_length = 0;
    (flag_name->field_2)._M_local_buf[0] = '\0';
    local_178 = (_Manager_type)0x0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    local_170 = fun->_M_invoker;
    p_Var4 = (fun->super__Function_base)._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      local_188._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor
      ;
      local_188._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
      (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
      fun->_M_invoker = (_Invoker_type)0x0;
      local_178 = p_Var4;
    }
    local_b8._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
    paVar1 = &flag_description->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar1) {
      local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b8._M_string_length = flag_description->_M_string_length;
    (flag_description->_M_dataplus)._M_p = (pointer)paVar1;
    flag_description->_M_string_length = 0;
    (flag_description->field_2)._M_local_buf[0] = '\0';
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    this_00 = add_option(local_160,&local_138,(callback_t *)&local_188,&local_b8,false,
                         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                          *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (local_178 != (_Manager_type)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    ppVar5 = local_118.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_118.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __x = local_118.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->fnames_,&__x->first);
        __x = __x + 1;
      } while (__x != ppVar5);
    }
    local_f8._M_dataplus._M_p =
         (pointer)(this_00->default_flag_values_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_string_length =
         (size_type)
         (this_00->default_flag_values_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_f8.field_2._M_allocated_capacity =
         (size_type)
         (this_00->default_flag_values_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_00->default_flag_values_).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_118.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this_00->default_flag_values_).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this_00->default_flag_values_).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_118.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_118.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_f8);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_118);
  }
  if ((this_00->pname_)._M_string_length == 0) {
    MVar2 = (this_00->super_OptionBase<CLI::Option>).multi_option_policy_;
    if (MVar2 != TakeLast) {
      if (((MVar2 == Throw) && (this_00->expected_max_ == 0x20000000)) &&
         (1 < this_00->expected_min_)) {
        this_00->expected_max_ = this_00->expected_min_;
      }
      (this_00->super_OptionBase<CLI::Option>).multi_option_policy_ = TakeLast;
      this_00->current_option_state_ = parsing;
    }
    this_00->expected_min_ = 0;
    this_00->expected_max_ = 0;
    this_00->flag_like_ = true;
    (this_00->super_OptionBase<CLI::Option>).required_ = false;
    return this_00;
  }
  Option::get_name_abi_cxx11_(&local_f8,this_00,true,false);
  remove_option(this,this_00);
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_f8._M_dataplus._M_p,
             local_f8._M_dataplus._M_p +
             (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_f8._M_string_length);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_50);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Option *App::_add_flag_internal(std::string flag_name, CLI::callback_t fun, std::string flag_description) {
    Option *opt = nullptr;
    if(detail::has_default_flag_values(flag_name)) {
        // check for default values and if it has them
        auto flag_defaults = detail::get_default_flag_values(flag_name);
        detail::remove_default_flag_values(flag_name);
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
        for(const auto &fname : flag_defaults)
            opt->fnames_.push_back(fname.first);
        opt->default_flag_values_ = std::move(flag_defaults);
    } else {
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
    }
    // flags cannot have positional values
    if(opt->get_positional()) {
        auto pos_name = opt->get_name(true);
        remove_option(opt);
        throw IncorrectConstruction::PositionalFlag(pos_name);
    }
    opt->multi_option_policy(MultiOptionPolicy::TakeLast);
    opt->expected(0);
    opt->required(false);
    return opt;
}